

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtc.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  clock_t cVar7;
  ulong uVar8;
  char *pcVar9;
  longlong lVar10;
  clock_t cVar11;
  clock_t cVar12;
  undefined1 local_550 [8];
  rusage r;
  clock_t c4;
  clock_t c3;
  clock_t c2;
  string local_4a0 [32];
  clock_t local_480;
  clock_t c1;
  string local_470 [39];
  allocator<char> local_449;
  undefined1 local_448 [8];
  string arg_3;
  undefined1 local_420 [8];
  string arg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  allocator<char> local_3a9;
  undefined1 local_3a8 [8];
  string arg_1;
  undefined1 local_380 [8];
  string arg;
  string local_358;
  char *local_338;
  char *options;
  undefined1 local_320 [8];
  check_manager checks;
  device_tree tree;
  clock_t c0;
  bool sort;
  bool keep_going;
  bool boot_cpu_specified;
  code *pcStack_60;
  uint32_t boot_cpu;
  tree_read_fn_ptr read_fn;
  code *local_50;
  tree_write_fn_ptr write_fn;
  FILE *pFStack_38;
  bool debug_mode;
  FILE *depfile;
  char *in_file;
  char *outfile_name;
  int outfile;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  outfile_name._0_4_ = fileno(_stdout);
  in_file = "-";
  depfile = (FILE *)0x1b973a;
  pFStack_38 = (FILE *)0x0;
  bVar3 = false;
  local_50 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  c0._4_4_ = 0;
  bVar5 = false;
  bVar2 = false;
  bVar1 = false;
  cVar7 = clock();
  dtc::fdt::device_tree::device_tree((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket)
  ;
  dtc::fdt::checking::check_manager::check_manager((check_manager *)local_320);
  local_338 = "@hqI:O:o:V:d:R:S:p:b:fi:svH:W:E:DP:";
LAB_0017a8ba:
  iVar6 = getopt(argc,argv,local_338);
  pcVar9 = _optarg;
  if (iVar6 == -1) {
    if (pcStack_60 == (code *)0x0) {
      pcStack_60 = dtc::fdt::device_tree::parse_dts;
    }
    if (local_50 == (code *)0x0) {
      local_50 = dtc::fdt::device_tree::write_binary;
    }
    if (_optind < argc) {
      depfile = (FILE *)argv[_optind];
    }
    if (pFStack_38 != (FILE *)0x0) {
      fputs(in_file,pFStack_38);
      fputs(": ",pFStack_38);
      fputs((char *)depfile,pFStack_38);
    }
    local_480 = clock();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_4a0,(char *)depfile,(allocator<char> *)((long)&c2 + 7));
    (*pcStack_60)(&checks.disabled_checkers._M_h._M_single_bucket,local_4a0,pFStack_38);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&c2 + 7));
    if (bVar5) {
      dtc::fdt::device_tree::set_boot_cpu
                ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,c0._4_4_);
    }
    if (bVar1) {
      dtc::fdt::device_tree::sort((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket);
    }
    if (pFStack_38 != (FILE *)0x0) {
      putc(10,pFStack_38);
      fclose(pFStack_38);
    }
    bVar5 = dtc::fdt::device_tree::is_valid
                      ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket);
    if ((bVar5) || (bVar2)) {
      cVar11 = clock();
      bVar5 = dtc::fdt::checking::check_manager::run_checks
                        ((check_manager *)local_320,
                         (device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,true);
      if ((bVar5) || (bVar2)) {
        cVar12 = clock();
        (*local_50)(&checks.disabled_checkers._M_h._M_single_bucket,(int)outfile_name);
        close((int)outfile_name);
        r.field_15.ru_nivcsw = clock();
        if (bVar3) {
          getrusage(RUSAGE_SELF,(rusage *)local_550);
          fprintf(_stderr,"Peak memory usage: %ld bytes\n",r.ru_stime.tv_usec);
          fprintf(_stderr,"Setup and option parsing took %f seconds\n",
                  (double)(local_480 - cVar7) / 1000000.0);
          fprintf(_stderr,"Parsing took %f seconds\n",(double)(cVar11 - local_480) / 1000000.0);
          fprintf(_stderr,"Checking took %f seconds\n",(double)(cVar12 - cVar11) / 1000000.0);
          fprintf(_stderr,"Generating output took %f seconds\n",
                  (double)(r.field_15.ru_nivcsw - cVar12) / 1000000.0);
          fprintf(_stderr,"Total time: %f seconds\n",
                  (double)(r.field_15.ru_nivcsw - cVar7) / 1000000.0);
          fclose(_stdin);
        }
        argv_local._4_4_ = 0;
        arg.field_2._8_4_ = 1;
      }
      else {
        argv_local._4_4_ = 1;
        arg.field_2._8_4_ = 1;
      }
    }
    else {
      fprintf(_stderr,"Failed to parse tree.\n");
      argv_local._4_4_ = 1;
      arg.field_2._8_4_ = 1;
    }
    goto LAB_0017bad6;
  }
  switch(iVar6) {
  case 0x40:
    goto LAB_0017a8ba;
  default:
    argv_local._4_4_ = 1;
    arg.field_2._8_4_ = 1;
    goto LAB_0017bad6;
  case 0x44:
    bVar3 = true;
    goto LAB_0017a8ba;
  case 0x45:
  case 0x57:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_448,pcVar9,&local_449);
    std::allocator<char>::~allocator(&local_449);
    uVar8 = std::__cxx11::string::size();
    if ((uVar8 < 4) || (iVar6 = strncmp(_optarg,"no-",3), iVar6 != 0)) {
      bVar4 = dtc::fdt::checking::check_manager::enable_checker
                        ((check_manager *)local_320,(string *)local_448);
      if (!bVar4) {
        fprintf(_stderr,"Checker %s either does not exist or is already enabled\n",_optarg);
      }
    }
    else {
      pcVar9 = _optarg + 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_470,pcVar9,(allocator<char> *)((long)&c1 + 7));
      std::__cxx11::string::operator=((string *)local_448,local_470);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)((long)&c1 + 7));
      bVar4 = dtc::fdt::checking::check_manager::disable_checker
                        ((check_manager *)local_320,(string *)local_448);
      if (!bVar4) {
        fprintf(_stderr,"Checker %s either does not exist or is already disabled\n",_optarg + 3);
      }
    }
    arg.field_2._8_4_ = 4;
    std::__cxx11::string::~string((string *)local_448);
    goto LAB_0017a8ba;
  case 0x48:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_420,pcVar9,(allocator<char> *)(arg_3.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(arg_3.field_2._M_local_buf + 0xf));
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_420,"both");
    if (bVar4) {
      dtc::fdt::device_tree::set_phandle_format
                ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,BOTH);
LAB_0017b20d:
      arg.field_2._8_4_ = 4;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_420,"epapr");
      if (bVar4) {
        dtc::fdt::device_tree::set_phandle_format
                  ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,EPAPR);
        goto LAB_0017b20d;
      }
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_420,"linux");
      if (bVar4) {
        dtc::fdt::device_tree::set_phandle_format
                  ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,LINUX);
        goto LAB_0017b20d;
      }
      fprintf(_stderr,"Unknown phandle format: %s\n",_optarg);
      argv_local._4_4_ = 1;
      arg.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_420);
    break;
  case 0x49:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_380,pcVar9,(allocator<char> *)(arg_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(arg_1.field_2._M_local_buf + 0xf));
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_380,"dtb");
    if (bVar4) {
      pcStack_60 = dtc::fdt::device_tree::parse_dtb;
      if (local_50 == (code *)0x0) {
        local_50 = dtc::fdt::device_tree::write_dts;
      }
LAB_0017ab9f:
      arg.field_2._8_4_ = 4;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_380,"dts");
      if (bVar4) {
        pcStack_60 = dtc::fdt::device_tree::parse_dts;
        goto LAB_0017ab9f;
      }
      fprintf(_stderr,"Unknown input format: %s\n",_optarg);
      argv_local._4_4_ = 1;
      arg.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_380);
    break;
  case 0x4f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,pcVar9,&local_3a9);
    std::allocator<char>::~allocator(&local_3a9);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3a8,"dtb");
    if (bVar4) {
      local_50 = dtc::fdt::device_tree::write_binary;
LAB_0017ad88:
      arg.field_2._8_4_ = 4;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3a8,"asm");
      if (bVar4) {
        local_50 = dtc::fdt::device_tree::write_asm;
        goto LAB_0017ad88;
      }
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3a8,"dts");
      if (bVar4) {
        local_50 = dtc::fdt::device_tree::write_dts;
        if (pcStack_60 == (code *)0x0) {
          pcStack_60 = dtc::fdt::device_tree::parse_dtb;
        }
        goto LAB_0017ad88;
      }
      fprintf(_stderr,"Unknown output format: %s\n",_optarg);
      argv_local._4_4_ = 1;
      arg.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_3a8);
    break;
  case 0x50:
    bVar4 = dtc::fdt::device_tree::parse_define
                      ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,_optarg);
    if (!bVar4) {
      fprintf(_stderr,"Invalid predefine value %s\n",_optarg);
    }
    goto LAB_0017a8ba;
  case 0x52:
    lVar10 = strtoll(_optarg,(char **)0x0,10);
    dtc::fdt::device_tree::set_empty_reserve_map_entries
              ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,(uint32_t)lVar10);
    goto LAB_0017a8ba;
  case 0x53:
    lVar10 = strtoll(_optarg,(char **)0x0,10);
    dtc::fdt::device_tree::set_blob_minimum_size
              ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,(uint32_t)lVar10);
    goto LAB_0017a8ba;
  case 0x56:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,pcVar9,&local_3d1);
    bVar4 = std::operator!=(&local_3d0,"17");
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    if (bVar4) {
      fprintf(_stderr,"Unknown output format version: %s\n",_optarg);
      argv_local._4_4_ = 1;
      arg.field_2._8_4_ = 1;
      goto LAB_0017bad6;
    }
    goto LAB_0017a8ba;
  case 0x62:
    lVar10 = strtoll(_optarg,(char **)0x0,10);
    c0._4_4_ = (uint32_t)lVar10;
    bVar5 = true;
    goto LAB_0017a8ba;
  case 100:
    if (pFStack_38 != (FILE *)0x0) {
      fclose(pFStack_38);
    }
    pcVar9 = _optarg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,pcVar9,(allocator<char> *)(arg_2.field_2._M_local_buf + 0xf));
    bVar4 = std::operator==(&local_3f8,"-");
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)(arg_2.field_2._M_local_buf + 0xf));
    if (bVar4) {
      pFStack_38 = _stdout;
    }
    else {
      iVar6 = open(_optarg,0x241,0x1b6);
      pFStack_38 = fdopen(iVar6,"w");
      if (pFStack_38 == (FILE *)0x0) {
        perror("Unable to open dependency file");
        argv_local._4_4_ = 1;
        arg.field_2._8_4_ = 1;
        goto LAB_0017bad6;
      }
    }
    goto LAB_0017a8ba;
  case 0x66:
    bVar2 = true;
    goto LAB_0017a8ba;
  case 0x68:
    pcVar9 = *argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,pcVar9,(allocator<char> *)(arg.field_2._M_local_buf + 0xf));
    anon_unknown.dwarf_16ca0::usage(&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator((allocator<char> *)(arg.field_2._M_local_buf + 0xf));
    argv_local._4_4_ = 0;
    arg.field_2._8_4_ = 1;
    goto LAB_0017bad6;
  case 0x69:
    dtc::fdt::device_tree::add_include_path
              ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,_optarg);
    goto LAB_0017a8ba;
  case 0x6f:
    goto switchD_0017a906_caseD_6f;
  case 0x70:
    lVar10 = strtoll(_optarg,(char **)0x0,10);
    dtc::fdt::device_tree::set_blob_padding
              ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket,(uint32_t)lVar10);
    goto LAB_0017a8ba;
  case 0x71:
    goto LAB_0017a8ba;
  case 0x73:
    bVar1 = true;
    goto LAB_0017a8ba;
  case 0x76:
    anon_unknown.dwarf_16ca0::version(*argv);
    argv_local._4_4_ = 0;
    arg.field_2._8_4_ = 1;
    goto LAB_0017bad6;
  }
  if (arg.field_2._8_4_ != 4) goto LAB_0017bad6;
  goto LAB_0017a8ba;
switchD_0017a906_caseD_6f:
  in_file = _optarg;
  iVar6 = strcmp(_optarg,"-");
  if ((iVar6 != 0) && (outfile_name._0_4_ = open(_optarg,0x241,0x1b6), (int)outfile_name == -1)) {
    perror("Unable to open output file");
    argv_local._4_4_ = 1;
    arg.field_2._8_4_ = 1;
LAB_0017bad6:
    dtc::fdt::checking::check_manager::~check_manager((check_manager *)local_320);
    dtc::fdt::device_tree::~device_tree
              ((device_tree *)&checks.disabled_checkers._M_h._M_single_bucket);
    return argv_local._4_4_;
  }
  goto LAB_0017a8ba;
}

Assistant:

int
main(int argc, char **argv)
{
	int ch;
	int outfile = fileno(stdout);
	const char *outfile_name = "-";
	const char *in_file = "-";
	FILE *depfile = 0;
	bool debug_mode = false;
	tree_write_fn_ptr write_fn = nullptr;
	tree_read_fn_ptr read_fn = nullptr;
	uint32_t boot_cpu = 0;
	bool boot_cpu_specified = false;
	bool keep_going = false;
	bool sort = false;
	clock_t c0 = clock();
	class device_tree tree;
	fdt::checking::check_manager checks;
	const char *options = "@hqI:O:o:V:d:R:S:p:b:fi:svH:W:E:DP:";

	// Don't forget to update the man page if any more options are added.
	while ((ch = getopt(argc, argv, options)) != -1)
	{
		switch (ch)
		{
		case 'h':
			usage(argv[0]);
			return EXIT_SUCCESS;
		case 'v':
			version(argv[0]);
			return EXIT_SUCCESS;
		case '@':
			tree.write_symbols = true;
			break;
		case 'I':
		{
			string arg(optarg);
			if (arg == "dtb")
			{
				read_fn = &device_tree::parse_dtb;
				if (write_fn == nullptr)
				{
					write_fn = &device_tree::write_dts;
				}
			}
			else if (arg == "dts")
			{
				read_fn = &device_tree::parse_dts;
			}
			else
			{
				fprintf(stderr, "Unknown input format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'O':
		{
			string arg(optarg);
			if (arg == "dtb")
			{
				write_fn = &device_tree::write_binary;
			}
			else if (arg == "asm")
			{
				write_fn = &device_tree::write_asm;
			}
			else if (arg == "dts")
			{
				write_fn = &device_tree::write_dts;
				if (read_fn == nullptr)
				{
					read_fn = &device_tree::parse_dtb;
				}
			}
			else
			{
				fprintf(stderr, "Unknown output format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'o':
		{
			outfile_name = optarg;
			if (strcmp(outfile_name, "-") != 0)
			{
				outfile = open(optarg, O_CREAT | O_TRUNC | O_WRONLY, 0666);
				if (outfile == -1)
				{
					perror("Unable to open output file");
					return EXIT_FAILURE;
				}
			}
			break;
		}
		case 'D':
			debug_mode = true;
			break;
		case 'V':
			if (string(optarg) != "17")
			{
				fprintf(stderr, "Unknown output format version: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		case 'd':
		{
			if (depfile != 0)
			{
				fclose(depfile);
			}
			if (string(optarg) == "-")
			{
				depfile = stdout;
			}
			else
			{
				depfile = fdopen(open(optarg, O_CREAT | O_TRUNC | O_WRONLY, 0666), "w");
				if (depfile == 0)
				{
					perror("Unable to open dependency file");
					return EXIT_FAILURE;
				}
			}
			break;
		}
		case 'H':
		{
			string arg(optarg);
			if (arg == "both")
			{
				tree.set_phandle_format(device_tree::BOTH);
			}
			else if (arg == "epapr")
			{
				tree.set_phandle_format(device_tree::EPAPR);
			}
			else if (arg == "linux")
			{
				tree.set_phandle_format(device_tree::LINUX);
			}
			else
			{
				fprintf(stderr, "Unknown phandle format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'b':
			// Don't bother to check if strtoll fails, just
			// use the 0 it returns.
			boot_cpu = (uint32_t)strtoll(optarg, 0, 10);
			boot_cpu_specified = true;
			break;
		case 'f':
			keep_going = true;
			break;
		case 'W':
		case 'E':
		{
			string arg(optarg);
			if ((arg.size() > 3) && (strncmp(optarg, "no-", 3) == 0))
			{
				arg = string(optarg+3);
				if (!checks.disable_checker(arg))
				{
					fprintf(stderr, "Checker %s either does not exist or is already disabled\n", optarg+3);
				}
				break;
			}
			if (!checks.enable_checker(arg))
			{
				fprintf(stderr, "Checker %s either does not exist or is already enabled\n", optarg);
			}
			break;
		}
		case 's':
		{
			sort = true;
			break;
		}
		case 'i':
		{
			tree.add_include_path(optarg);
			break;
		}
		// Should quiet warnings, but for now is silently ignored.
		case 'q':
			break;
		case 'R':
			tree.set_empty_reserve_map_entries(strtoll(optarg, 0, 10));
			break;
		case 'S':
			tree.set_blob_minimum_size(strtoll(optarg, 0, 10));
			break;
		case 'p':
			tree.set_blob_padding(strtoll(optarg, 0, 10));
			break;
		case 'P':
			if (!tree.parse_define(optarg))
			{
				fprintf(stderr, "Invalid predefine value %s\n",
				        optarg);
			}
			break;
		default:
			/* 
			 * Since opterr is non-zero, getopt will have
			 * already printed an error message.
			 */
			return EXIT_FAILURE;
		}
	}
	if (read_fn == nullptr)
	{
		read_fn = &device_tree::parse_dts;
	}
	if (write_fn == nullptr)
	{
		write_fn = &device_tree::write_binary;
	}
	if (optind < argc)
	{
		in_file = argv[optind];
	}
	if (depfile != 0)
	{
		fputs(outfile_name, depfile);
		fputs(": ", depfile);
		fputs(in_file, depfile);
	}
	clock_t c1 = clock();
	(tree.*read_fn)(in_file, depfile);
	// Override the boot CPU found in the header, if we're loading from dtb
	if (boot_cpu_specified)
	{
		tree.set_boot_cpu(boot_cpu);
	}
	if (sort)
	{
		tree.sort();
	}
	if (depfile != 0)
	{
		putc('\n', depfile);
		fclose(depfile);
	}
	if (!(tree.is_valid() || keep_going))
	{
		fprintf(stderr, "Failed to parse tree.\n");
		return EXIT_FAILURE;
	}
	clock_t c2 = clock();
	if (!(checks.run_checks(&tree, true) || keep_going))
	{
		return EXIT_FAILURE;
	}
	clock_t c3 = clock();
	(tree.*write_fn)(outfile);
	close(outfile);
	clock_t c4 = clock();

	if (debug_mode)
	{
		struct rusage r;

		getrusage(RUSAGE_SELF, &r);
		fprintf(stderr, "Peak memory usage: %ld bytes\n", r.ru_maxrss);
		fprintf(stderr, "Setup and option parsing took %f seconds\n",
				((double)(c1-c0))/CLOCKS_PER_SEC);
		fprintf(stderr, "Parsing took %f seconds\n",
				((double)(c2-c1))/CLOCKS_PER_SEC);
		fprintf(stderr, "Checking took %f seconds\n",
				((double)(c3-c2))/CLOCKS_PER_SEC);
		fprintf(stderr, "Generating output took %f seconds\n",
				((double)(c4-c3))/CLOCKS_PER_SEC);
		fprintf(stderr, "Total time: %f seconds\n",
				((double)(c4-c0))/CLOCKS_PER_SEC);
		// This is not needed, but keeps valgrind quiet.
		fclose(stdin);
	}
	return EXIT_SUCCESS;
}